

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,void *ptr)

{
  ImU32 IVar1;
  uint *puVar2;
  void *pvStack_18;
  ImGuiID seed;
  void *ptr_local;
  ImGuiWindow *this_local;
  
  pvStack_18 = ptr;
  ptr_local = this;
  puVar2 = ImVector<unsigned_int>::back(&this->IDStack);
  IVar1 = ImHashData(&stack0xffffffffffffffe8,8,*puVar2);
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    return ImHashData(&ptr, sizeof(void*), seed);
}